

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::CalcItemWidth(void)

{
  ImGuiWindow_conflict *pIVar1;
  ImVec2 IVar2;
  float local_28;
  float local_1c;
  float region_max_x;
  float w;
  ImGuiWindow_conflict *window;
  ImGuiContext_conflict *g;
  
  pIVar1 = GImGui->CurrentWindow;
  if (((GImGui->NextItemData).Flags & 1U) == 0) {
    local_1c = (pIVar1->DC).ItemWidth;
  }
  else {
    local_1c = (GImGui->NextItemData).Width;
  }
  if (local_1c < 0.0) {
    IVar2 = GetContentRegionMaxAbs();
    local_28 = IVar2.x;
    local_1c = ImMax<float>(1.0,(local_28 - (pIVar1->DC).CursorPos.x) + local_1c);
  }
  return (float)(int)local_1c;
}

Assistant:

float ImGui::CalcItemWidth()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float w;
    if (g.NextItemData.Flags & ImGuiNextItemDataFlags_HasWidth)
        w = g.NextItemData.Width;
    else
        w = window->DC.ItemWidth;
    if (w < 0.0f)
    {
        float region_max_x = GetContentRegionMaxAbs().x;
        w = ImMax(1.0f, region_max_x - window->DC.CursorPos.x + w);
    }
    w = IM_FLOOR(w);
    return w;
}